

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLUri::buildFullText(XMLUri *this)

{
  int iVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  XMLSize_t XVar6;
  XMLSize_t XVar7;
  undefined4 extraout_var;
  XMLCh *src;
  XMLCh *pXVar8;
  XMLCh *local_68;
  XMLCh local_48 [4];
  XMLCh tmpBuf [17];
  XMLCh *outPtr;
  XMLSize_t bufSize;
  XMLUri *this_local;
  
  XVar2 = XMLString::stringLen(this->fScheme);
  XVar3 = XMLString::stringLen(this->fFragment);
  if (this->fHost == (XMLCh *)0x0) {
    local_68 = this->fRegAuth;
  }
  else {
    local_68 = this->fHost;
  }
  XVar4 = XMLString::stringLen(local_68);
  XVar5 = XMLString::stringLen(this->fPath);
  XVar6 = XMLString::stringLen(this->fQueryString);
  XVar7 = XMLString::stringLen(this->fUserInfo);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fURIText);
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,(XVar2 + XVar3 + XVar4 + XVar5 + XVar6 + XVar7 + 0x26) * 2
                    );
  this->fURIText = (XMLCh *)CONCAT44(extraout_var,iVar1);
  *this->fURIText = L'\0';
  unique0x00012000 = this->fURIText;
  if (this->fScheme != (XMLCh *)0x0) {
    pXVar8 = this->fURIText;
    src = getScheme(this);
    XMLString::catString(pXVar8,src);
    XVar2 = XMLString::stringLen(this->fURIText);
    pXVar8 = stack0xffffffffffffffe0 + XVar2;
    register0x00000008 = pXVar8 + 1;
    *pXVar8 = L':';
  }
  if ((this->fHost != (XMLCh *)0x0) || (this->fRegAuth != (XMLCh *)0x0)) {
    pXVar8 = stack0xffffffffffffffe0 + 1;
    *stack0xffffffffffffffe0 = L'/';
    register0x00000010 = stack0xffffffffffffffe0 + 2;
    *pXVar8 = L'/';
    if (this->fHost == (XMLCh *)0x0) {
      XMLString::copyString(register0x00000010,this->fRegAuth);
      XVar2 = XMLString::stringLen(this->fRegAuth);
      unique0x1000041d = stack0xffffffffffffffe0 + XVar2;
    }
    else {
      if (this->fUserInfo != (XMLCh *)0x0) {
        XMLString::copyString(register0x00000010,this->fUserInfo);
        XVar2 = XMLString::stringLen(this->fUserInfo);
        pXVar8 = stack0xffffffffffffffe0 + XVar2;
        register0x00000008 = pXVar8 + 1;
        *pXVar8 = L'@';
      }
      XMLString::copyString(stack0xffffffffffffffe0,this->fHost);
      XVar2 = XMLString::stringLen(this->fHost);
      pXVar8 = stack0xffffffffffffffe0 + XVar2;
      unique0x10000425 = pXVar8;
      if (this->fPort != -1) {
        register0x00000010 = pXVar8 + 1;
        *pXVar8 = L':';
        XMLString::binToText(this->fPort,local_48,0x10,10,this->fMemoryManager);
        XMLString::copyString(stack0xffffffffffffffe0,local_48);
        XVar2 = XMLString::stringLen(local_48);
        register0x00000000 = stack0xffffffffffffffe0 + XVar2;
      }
    }
  }
  if (this->fPath != (XMLCh *)0x0) {
    XMLString::copyString(stack0xffffffffffffffe0,this->fPath);
    XVar2 = XMLString::stringLen(this->fPath);
    register0x00000000 = stack0xffffffffffffffe0 + XVar2;
  }
  if (this->fQueryString != (XMLCh *)0x0) {
    pXVar8 = stack0xffffffffffffffe0 + 1;
    *stack0xffffffffffffffe0 = L'?';
    unique0x10000405 = pXVar8;
    XMLString::copyString(pXVar8,this->fQueryString);
    XVar2 = XMLString::stringLen(this->fQueryString);
    register0x00000000 = stack0xffffffffffffffe0 + XVar2;
  }
  if (this->fFragment != (XMLCh *)0x0) {
    pXVar8 = stack0xffffffffffffffe0 + 1;
    *stack0xffffffffffffffe0 = L'#';
    unique0x1000040d = pXVar8;
    XMLString::copyString(pXVar8,this->fFragment);
    XVar2 = XMLString::stringLen(this->fFragment);
    register0x00000000 = stack0xffffffffffffffe0 + XVar2;
  }
  *stack0xffffffffffffffe0 = L'\0';
  return;
}

Assistant:

void XMLUri::buildFullText()
{
    // Calculate the worst case size of the buffer required
    XMLSize_t bufSize = XMLString::stringLen(fScheme) + 1
                           + XMLString::stringLen(fFragment) + 1
                           + XMLString::stringLen(fHost ? fHost : fRegAuth) + 2
                           + XMLString::stringLen(fPath)
                           + XMLString::stringLen(fQueryString) + 1
                           + XMLString::stringLen(fUserInfo) + 1
                           + 32;

    // Clean up the existing buffer and allocate another
    fMemoryManager->deallocate(fURIText);//delete [] fURIText;
    fURIText = (XMLCh*) fMemoryManager->allocate(bufSize * sizeof(XMLCh));//new XMLCh[bufSize];
    *fURIText = 0;

    XMLCh* outPtr = fURIText;
    if (fScheme != 0)
    {
        XMLString::catString(fURIText, getScheme());
        outPtr += XMLString::stringLen(fURIText);
        *outPtr++ = chColon;
    }

    // Authority
    if (fHost || fRegAuth)
    {
        *outPtr++ = chForwardSlash;
        *outPtr++ = chForwardSlash;

        // Server based authority.
        if (fHost)
        {
            if (fUserInfo)
            {
                XMLString::copyString(outPtr, fUserInfo);
                outPtr += XMLString::stringLen(fUserInfo);
                *outPtr++ = chAt;
            }

            XMLString::copyString(outPtr, fHost);
            outPtr += XMLString::stringLen(fHost);

            //
            //  If the port is -1, then we don't put it in. Else we need
            //  to because it was explicitly provided.
            //
            if (fPort != -1)
            {
                *outPtr++ = chColon;

                XMLCh tmpBuf[17];
                XMLString::binToText(fPort, tmpBuf, 16, 10, fMemoryManager);
                XMLString::copyString(outPtr, tmpBuf);
                outPtr += XMLString::stringLen(tmpBuf);
            }
        }
        // Registry based authority.
        else {
            XMLString::copyString(outPtr, fRegAuth);
            outPtr += XMLString::stringLen(fRegAuth);
        }
    }

    if (fPath)
    {
        XMLString::copyString(outPtr, fPath);
        outPtr += XMLString::stringLen(fPath);
    }

    if (fQueryString)
    {
        *outPtr++ = chQuestion;
        XMLString::copyString(outPtr, fQueryString);
        outPtr += XMLString::stringLen(fQueryString);
    }

    if (fFragment)
    {
        *outPtr++ = chPound;
        XMLString::copyString(outPtr, fFragment);
        outPtr += XMLString::stringLen(fFragment);
    }

    // Cap it off in case the last op was not a string copy
    *outPtr = 0;
}